

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::occluded
          (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  char **ppcVar1;
  OccludedFunc4 *pp_Var2;
  long lVar3;
  GridSOA *pGVar4;
  long lVar5;
  uint uVar6;
  NodeRef root;
  code *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  IntersectFunc4 p_Var17;
  OccludedFunc4 p_Var18;
  char *pcVar19;
  IntersectFunc4 p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  GridSOA *pGVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  RTCRayN *pRVar32;
  int iVar33;
  undefined4 uVar34;
  int iVar35;
  RayK<4> *pRVar36;
  ulong uVar37;
  size_t sVar38;
  Intersectors *pIVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar45;
  GridSOA *pGVar46;
  ulong uVar47;
  GridSOA *pGVar48;
  NodeRef *pNVar49;
  bool bVar50;
  float fVar51;
  float fVar75;
  float fVar76;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar77;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  float fVar92;
  float fVar93;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar94;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar108;
  float fVar110;
  undefined1 auVar97 [16];
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar114;
  float fVar115;
  float fVar124;
  float fVar126;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar139;
  float fVar144;
  undefined1 auVar133 [16];
  float fVar140;
  float fVar145;
  float fVar149;
  float fVar150;
  undefined1 auVar134 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar163;
  float fVar170;
  float fVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar172;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar176;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar184;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  uint uVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  uint uVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  uint uVar204;
  uint uVar205;
  float fVar206;
  float fVar207;
  uint uVar208;
  float fVar209;
  float fVar210;
  uint uVar211;
  float fVar212;
  float fVar213;
  uint uVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  TravRayK<4,_true> *tray_00;
  uint local_1b58;
  uint uStack_1b54;
  uint uStack_1b50;
  uint uStack_1b4c;
  float local_1b48;
  float fStack_1b44;
  float fStack_1b40;
  float fStack_1b3c;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  float local_1af8;
  float fStack_1af4;
  float fStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  float local_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  undefined1 local_1ab8 [16];
  BVH *local_1aa8;
  Intersectors *local_1aa0;
  GridSOA *local_1a98;
  GridSOA *local_1a90;
  GridSOA *local_1a88;
  GridSOA *local_1a80;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  vbool<4> terminated;
  GridSOA *local_1a48;
  GridSOA *local_1a40;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_19f0;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined1 local_1948 [16];
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  undefined4 local_1918;
  undefined4 uStack_1914;
  undefined4 uStack_1910;
  undefined4 uStack_190c;
  uint local_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  undefined4 local_18f8;
  undefined4 uStack_18f4;
  undefined4 uStack_18f0;
  undefined4 uStack_18ec;
  undefined4 local_18e8;
  undefined4 uStack_18e4;
  undefined4 uStack_18e0;
  undefined4 uStack_18dc;
  TravRayK<4,_true> tray;
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined8 local_1738;
  undefined8 uStack_1730;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined8 local_1718;
  undefined8 uStack_1710;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  GridSOA *pGVar31;
  
  auVar91 = mm_lookupmask_ps._0_16_;
  local_1aa8 = (BVH *)(valid_i->field_0).v[0];
  if ((local_1aa8->root).ptr != 8) {
    pRVar36 = ray;
    if ((*(long *)(ray + 8) != 0) &&
       (pRVar36 = *(RayK<4> **)(ray + 0x10), ((byte)pRVar36[2] & 1) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar178._8_4_ = 0xffffffff;
    auVar178._0_8_ = 0xffffffffffffffff;
    auVar178._12_4_ = 0xffffffff;
    auVar157 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar186._0_12_ = ZEXT812(0);
    auVar186._12_4_ = 0;
    uVar205 = -(uint)(0.0 <= auVar157._0_4_ && *(int *)this == -1);
    uVar208 = -(uint)(0.0 <= auVar157._4_4_ && *(int *)(this + 4) == -1);
    uVar211 = -(uint)(0.0 <= auVar157._8_4_ && *(int *)(this + 8) == -1);
    uVar214 = -(uint)(0.0 <= auVar157._12_4_ && *(int *)(this + 0xc) == -1);
    auVar79._4_4_ = uVar208;
    auVar79._0_4_ = uVar205;
    auVar79._8_4_ = uVar211;
    auVar79._12_4_ = uVar214;
    iVar33 = movmskps((int)pRVar36,auVar79);
    if (iVar33 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = This->ptr;
      tray.org.field_0._8_8_ = This->leafIntersector;
      tray.org.field_0._16_8_ = (This->collider).collide;
      tray.org.field_0._24_8_ = (This->collider).name;
      tray.org.field_0._32_8_ = (This->intersector1).intersect;
      tray.org.field_0._40_8_ = (This->intersector1).occluded;
      tray.dir.field_0._0_8_ = (This->intersector4).intersect;
      tray.dir.field_0._8_8_ = (This->intersector4).occluded;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)*(undefined1 (*) [16])&(This->intersector4).name;
      tray.dir.field_0._32_8_ = (This->intersector4_filter).occluded;
      tray.dir.field_0._40_8_ = (This->intersector4_filter).name;
      auVar173 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar52._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._0_8_ >> 0x20)) < 1e-18);
      auVar52._0_4_ = -(uint)(ABS((float)tray.dir.field_0._0_8_) < 1e-18);
      auVar52._8_4_ = -(uint)(ABS((float)tray.dir.field_0._8_8_) < 1e-18);
      auVar52._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._8_8_ >> 0x20)) < 1e-18);
      auVar116 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < 1e-18);
      auVar53._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < 1e-18);
      auVar79 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar173,_DAT_0201c930,auVar52)
      ;
      auVar53._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < 1e-18);
      auVar53._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar116,_DAT_0201c930,auVar53)
      ;
      auVar173._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._32_8_ >> 0x20)) < 1e-18);
      auVar173._0_4_ = -(uint)(ABS((float)tray.dir.field_0._32_8_) < 1e-18);
      auVar173._8_4_ = -(uint)(ABS((float)tray.dir.field_0._40_8_) < 1e-18);
      auVar173._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._40_8_ >> 0x20)) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar79,_DAT_0201c930,auVar173)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar54._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar54._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar54._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar54._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar54);
      auVar55._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar55._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar55._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar55._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar55);
      auVar116._0_8_ = (This->intersector1).pointQuery;
      auVar116._8_8_ = (This->intersector1).name;
      auVar79 = maxps(auVar116,auVar186);
      auVar157 = maxps(auVar157,auVar186);
      fVar190 = (float)DAT_01feb9f0;
      fVar193 = DAT_01feb9f0._4_4_;
      fVar197 = DAT_01feb9f0._8_4_;
      fVar201 = DAT_01feb9f0._12_4_;
      auVar56._4_4_ = uVar208;
      auVar56._0_4_ = uVar205;
      auVar56._8_4_ = uVar211;
      auVar56._12_4_ = uVar214;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar79,auVar56);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feba00,auVar157,auVar56);
      auVar157._4_4_ = uVar208;
      auVar157._0_4_ = uVar205;
      auVar157._8_4_ = uVar211;
      auVar157._12_4_ = uVar214;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar178 ^ auVar157);
      if (*(long *)(ray + 8) == 0) {
        uVar43 = 3;
      }
      else {
        uVar43 = ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) == 0) + 2;
      }
      pNVar49 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (local_1aa8->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar33 = 0x224ff80;
      local_1aa0 = (Intersectors *)valid_i;
      paVar44 = &stack_near[2].field_0;
LAB_00252cf1:
      paVar45 = paVar44 + -1;
      root.ptr = pNVar49[-1].ptr;
      pNVar49 = pNVar49 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_002542ce;
      local_1b48 = paVar45->v[0];
      fStack_1b44 = *(float *)((long)paVar44 + -0xc);
      fStack_1b40 = *(float *)((long)paVar44 + -8);
      fStack_1b3c = *(float *)((long)paVar44 + -4);
      auVar157 = *(undefined1 (*) [16])paVar45->v;
      auVar57._4_4_ = -(uint)(fStack_1b44 < tray.tfar.field_0.v[1]);
      auVar57._0_4_ = -(uint)(local_1b48 < tray.tfar.field_0.v[0]);
      auVar57._8_4_ = -(uint)(fStack_1b40 < tray.tfar.field_0.v[2]);
      auVar57._12_4_ = -(uint)(fStack_1b3c < tray.tfar.field_0.v[3]);
      uVar28 = movmskps(iVar33,auVar57);
      if (uVar28 == 0) {
LAB_002542df:
        iVar33 = 2;
      }
      else {
        uVar47 = (ulong)(uVar28 & 0xff);
        uVar28 = POPCOUNT(uVar28 & 0xff);
        iVar33 = 0;
        if (uVar28 <= uVar43) {
          do {
            sVar38 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> sVar38 & 1) == 0; sVar38 = sVar38 + 1) {
              }
            }
            tray_00 = &tray;
            this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>
                    *)local_1aa0;
            bVar50 = occluded1(local_1aa0,local_1aa8,root,sVar38,&pre,(RayK<4> *)This,tray_00,
                               (RayQueryContext *)ray);
            if (bVar50) {
              terminated.field_0.i[sVar38] = -1;
            }
            uVar47 = uVar47 & uVar47 - 1;
          } while (uVar47 != 0);
          iVar35 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          iVar33 = 3;
          fVar190 = INFINITY;
          fVar193 = INFINITY;
          fVar197 = INFINITY;
          fVar201 = INFINITY;
          local_1b48 = auVar157._0_4_;
          fStack_1b44 = auVar157._4_4_;
          fStack_1b40 = auVar157._8_4_;
          fStack_1b3c = auVar157._12_4_;
          if (iVar35 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,(undefined1  [16])_DAT_01feba00,
                          (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
        }
        pGVar27 = pre.super_Precalculations.grid;
        if (uVar43 < uVar28) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002542ce;
              auVar62._4_4_ = -(uint)(fStack_1b44 < tray.tfar.field_0.v[1]);
              auVar62._0_4_ = -(uint)(local_1b48 < tray.tfar.field_0.v[0]);
              auVar62._8_4_ = -(uint)(fStack_1b40 < tray.tfar.field_0.v[2]);
              auVar62._12_4_ = -(uint)(fStack_1b3c < tray.tfar.field_0.v[3]);
              iVar33 = movmskps(iVar33,auVar62);
              if (iVar33 == 0) goto LAB_002542df;
              if (((uint)root.ptr & 0xf) != 8) {
                pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                uVar28 = *(uint *)(pre.super_Precalculations.grid + 0x2c);
                sVar38 = *(size_t *)(pre.super_Precalculations.grid + (ulong)uVar28 + 0x30);
                auVar169 = auVar91;
                goto LAB_0025426a;
              }
              auVar86._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar86._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              auVar86._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              uVar47 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
              uVar37 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
              uVar28 = *(uint *)(pre.super_Precalculations.grid + 0x10);
              lVar5 = uVar37 * 4;
              lVar40 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24) + (root.ptr >> 4) * 4
              ;
              lVar42 = uVar47 * 0xc + lVar40;
              pGVar48 = pre.super_Precalculations.grid + lVar42 + uVar37 * 4 + 0x2c;
              lVar41 = lVar40 + uVar47 * 8;
              local_1a80 = pre.super_Precalculations.grid + lVar41 + uVar37 * 4 + 0x30;
              lVar3 = lVar40 + uVar47 * 4;
              local_1a88 = pre.super_Precalculations.grid + lVar3 + uVar37 * 4 + 0x30;
              local_1a90 = pre.super_Precalculations.grid + lVar40 + uVar37 * 4 + 0x30;
              local_1a98 = pre.super_Precalculations.grid + lVar42 + 0x30;
              this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>
                      *)(ulong)uVar28;
              local_1a40 = pre.super_Precalculations.grid + lVar41 + 0x30;
              pGVar46 = pre.super_Precalculations.grid + lVar3 + 0x30;
              lVar40 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24) + (root.ptr >> 4) * 4
                       + 0x2c;
              local_1a48 = (GridSOA *)0x0;
              goto LAB_0025300d;
            }
            pIVar39 = (Intersectors *)0x0;
            uVar47 = 8;
            local_1b48 = fVar190;
            fStack_1b44 = fVar193;
            fStack_1b40 = fVar197;
            fStack_1b3c = fVar201;
            do {
              uVar37 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + (long)pIVar39 * 8);
              if (uVar37 != 8) {
                fVar156 = *(float *)(root.ptr + 0x20 + (long)pIVar39 * 4);
                fVar219 = *(float *)(root.ptr + 0x30 + (long)pIVar39 * 4);
                fVar225 = *(float *)(root.ptr + 0x40 + (long)pIVar39 * 4);
                fVar151 = *(float *)(root.ptr + 0x50 + (long)pIVar39 * 4);
                auVar80._0_8_ =
                     CONCAT44((fVar156 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                              (fVar156 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
                auVar80._8_4_ = (fVar156 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
                auVar80._12_4_ =
                     (fVar156 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
                auVar58._0_8_ =
                     CONCAT44((fVar225 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_,
                              (fVar225 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_)
                ;
                auVar58._8_4_ =
                     (fVar225 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
                auVar58._12_4_ =
                     (fVar225 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
                fVar156 = *(float *)(root.ptr + 0x60 + (long)pIVar39 * 4);
                auVar133._0_8_ =
                     CONCAT44((fVar156 - (float)tray.org.field_0._36_4_) *
                              (float)tray.rdir.field_0._36_4_,
                              (fVar156 - (float)tray.org.field_0._32_4_) *
                              (float)tray.rdir.field_0._32_4_);
                auVar133._8_4_ =
                     (fVar156 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar133._12_4_ =
                     (fVar156 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
                auVar97._0_4_ = (fVar219 - (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_;
                auVar97._4_4_ = (fVar219 - (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_;
                auVar97._8_4_ = (fVar219 - (float)tray.org.field_0._8_4_) * tray.rdir.field_0._8_4_;
                auVar97._12_4_ =
                     (fVar219 - (float)tray.org.field_0._12_4_) * tray.rdir.field_0._12_4_;
                auVar117._0_4_ =
                     (fVar151 - (float)tray.org.field_0._16_4_) * tray.rdir.field_0._16_4_;
                auVar117._4_4_ =
                     (fVar151 - (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_;
                auVar117._8_4_ =
                     (fVar151 - (float)tray.org.field_0._24_4_) * tray.rdir.field_0._24_4_;
                auVar117._12_4_ =
                     (fVar151 - (float)tray.org.field_0._28_4_) * tray.rdir.field_0._28_4_;
                fVar156 = *(float *)(root.ptr + 0x70 + (long)pIVar39 * 4);
                auVar158._0_4_ =
                     (fVar156 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
                auVar158._4_4_ =
                     (fVar156 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
                auVar158._8_4_ =
                     (fVar156 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar158._12_4_ =
                     (fVar156 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
                auVar154._8_4_ = auVar80._8_4_;
                auVar154._0_8_ = auVar80._0_8_;
                auVar154._12_4_ = auVar80._12_4_;
                auVar157 = minps(auVar154,auVar97);
                auVar164._8_4_ = auVar58._8_4_;
                auVar164._0_8_ = auVar58._0_8_;
                auVar164._12_4_ = auVar58._12_4_;
                auVar79 = minps(auVar164,auVar117);
                auVar157 = maxps(auVar157,auVar79);
                auVar165._8_4_ = auVar133._8_4_;
                auVar165._0_8_ = auVar133._0_8_;
                auVar165._12_4_ = auVar133._12_4_;
                auVar79 = minps(auVar165,auVar158);
                auVar157 = maxps(auVar157,auVar79);
                auVar155._0_8_ = CONCAT44(auVar157._4_4_ * 0.99999964,auVar157._0_4_ * 0.99999964);
                auVar155._8_4_ = auVar157._8_4_ * 0.99999964;
                auVar155._12_4_ = auVar157._12_4_ * 0.99999964;
                auVar79 = maxps(auVar80,auVar97);
                auVar157 = maxps(auVar58,auVar117);
                auVar157 = minps(auVar79,auVar157);
                auVar79 = maxps(auVar133,auVar158);
                auVar157 = minps(auVar157,auVar79);
                auVar81._0_4_ = auVar157._0_4_ * 1.0000004;
                auVar81._4_4_ = auVar157._4_4_ * 1.0000004;
                auVar81._8_4_ = auVar157._8_4_ * 1.0000004;
                auVar81._12_4_ = auVar157._12_4_ * 1.0000004;
                auVar59._8_4_ = auVar155._8_4_;
                auVar59._0_8_ = auVar155._0_8_;
                auVar59._12_4_ = auVar155._12_4_;
                auVar157 = maxps(auVar59,(undefined1  [16])tray.tnear.field_0);
                auVar79 = minps(auVar81,(undefined1  [16])tray.tfar.field_0);
                auVar60._4_4_ = -(uint)(auVar157._4_4_ <= auVar79._4_4_);
                auVar60._0_4_ = -(uint)(auVar157._0_4_ <= auVar79._0_4_);
                auVar60._8_4_ = -(uint)(auVar157._8_4_ <= auVar79._8_4_);
                auVar60._12_4_ = -(uint)(auVar157._12_4_ <= auVar79._12_4_);
                uVar28 = movmskps((int)this,auVar60);
                this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>
                        *)(ulong)uVar28;
                if (uVar28 != 0) {
                  auVar82._4_4_ = fVar193;
                  auVar82._0_4_ = fVar190;
                  auVar82._8_4_ = fVar197;
                  auVar82._12_4_ = fVar201;
                  auVar157 = blendvps(auVar82,auVar155,auVar60);
                  if (uVar47 != 8) {
                    pNVar49->ptr = uVar47;
                    pNVar49 = pNVar49 + 1;
                    paVar45->v[0] = local_1b48;
                    paVar45->v[1] = fStack_1b44;
                    paVar45->v[2] = fStack_1b40;
                    paVar45->v[3] = fStack_1b3c;
                    paVar45 = paVar45 + 1;
                  }
                  local_1b48 = auVar157._0_4_;
                  fStack_1b44 = auVar157._4_4_;
                  fStack_1b40 = auVar157._8_4_;
                  fStack_1b3c = auVar157._12_4_;
                  uVar47 = uVar37;
                }
              }
            } while ((uVar37 != 8) &&
                    (this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>
                             *)((long)&pIVar39->ptr + 1), bVar50 = pIVar39 < (Intersectors *)0x3,
                    pIVar39 = (Intersectors *)this, bVar50));
            iVar33 = 0;
            if (uVar47 == 8) {
LAB_00252eda:
              bVar50 = false;
              iVar33 = 4;
            }
            else {
              auVar61._4_4_ = -(uint)(fStack_1b44 < tray.tfar.field_0.v[1]);
              auVar61._0_4_ = -(uint)(local_1b48 < tray.tfar.field_0.v[0]);
              auVar61._8_4_ = -(uint)(fStack_1b40 < tray.tfar.field_0.v[2]);
              auVar61._12_4_ = -(uint)(fStack_1b3c < tray.tfar.field_0.v[3]);
              uVar34 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar61);
              bVar50 = true;
              if ((uint)POPCOUNT(uVar34) <= uVar43) {
                pNVar49->ptr = uVar47;
                pNVar49 = pNVar49 + 1;
                paVar45->v[0] = local_1b48;
                paVar45->v[1] = fStack_1b44;
                paVar45->v[2] = fStack_1b40;
                paVar45->v[3] = fStack_1b3c;
                paVar45 = paVar45 + 1;
                goto LAB_00252eda;
              }
            }
            root.ptr = uVar47;
          } while (bVar50);
        }
      }
      goto LAB_002542d1;
    }
  }
  return;
  while( true ) {
    pGVar31 = local_1a48 + 1;
    pGVar48 = pGVar48 + lVar5;
    local_1a80 = local_1a80 + lVar5;
    local_1a88 = local_1a88 + lVar5;
    local_1a90 = local_1a90 + lVar5;
    local_1a98 = local_1a98 + lVar5;
    local_1a40 = local_1a40 + lVar5;
    pGVar46 = pGVar46 + lVar5;
    lVar40 = lVar40 + lVar5;
    bVar50 = local_1a48 != (GridSOA *)0x0;
    local_1a48 = pGVar31;
    if (bVar50) break;
LAB_0025300d:
    pGVar4 = pGVar27 + lVar40;
    lVar41 = 0;
    pGVar31 = pGVar4;
    do {
      if ((ulong)(uVar37 != 2) * 4 + 4 == lVar41) break;
      fVar190 = *(float *)(pGVar4 + lVar41);
      fVar193 = *(float *)(pGVar4 + lVar41 + 4);
      fStack_1a6c = *(float *)(pGVar46 + lVar41 + -4);
      fVar197 = *(float *)(pGVar46 + lVar41);
      fVar201 = *(float *)(local_1a40 + lVar41 + -4);
      fVar156 = *(float *)(local_1a40 + lVar41);
      fVar219 = *(float *)(local_1a90 + lVar41 + -4);
      fVar225 = *(float *)(local_1a88 + lVar41 + -4);
      fVar151 = *(float *)(local_1a80 + lVar41 + -4);
      fVar131 = *(float *)&This->ptr;
      fVar140 = *(float *)((long)&This->ptr + 4);
      fVar145 = *(float *)&This->leafIntersector;
      fVar150 = *(float *)((long)&This->leafIntersector + 4);
      fVar51 = *(float *)&(This->collider).collide;
      fVar75 = *(float *)((long)&(This->collider).collide + 4);
      fVar76 = *(float *)&(This->collider).name;
      fVar77 = *(float *)((long)&(This->collider).name + 4);
      fVar78 = *(float *)&(This->intersector1).intersect;
      fVar92 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar93 = *(float *)&(This->intersector1).occluded;
      fVar94 = *(float *)((long)&(This->intersector1).occluded + 4);
      fVar223 = fVar190 - fVar131;
      fVar226 = fVar190 - fVar140;
      fVar228 = fVar190 - fVar145;
      fVar190 = fVar190 - fVar150;
      local_1a78._0_4_ = fStack_1a6c - fVar51;
      local_1a78._4_4_ = fStack_1a6c - fVar75;
      fStack_1a70 = fStack_1a6c - fVar76;
      fStack_1a6c = fStack_1a6c - fVar77;
      fVar220 = fVar201 - fVar78;
      fVar221 = fVar201 - fVar92;
      fVar222 = fVar201 - fVar93;
      fVar201 = fVar201 - fVar94;
      fVar191 = fVar193 - fVar131;
      fVar194 = fVar193 - fVar140;
      fVar198 = fVar193 - fVar145;
      fVar202 = fVar193 - fVar150;
      fVar130 = fVar197 - fVar51;
      fVar139 = fVar197 - fVar75;
      fVar144 = fVar197 - fVar76;
      fVar149 = fVar197 - fVar77;
      fVar163 = fVar156 - fVar78;
      fVar170 = fVar156 - fVar92;
      fVar171 = fVar156 - fVar93;
      fVar172 = fVar156 - fVar94;
      fVar131 = fVar219 - fVar131;
      fVar140 = fVar219 - fVar140;
      fVar145 = fVar219 - fVar145;
      fVar150 = fVar219 - fVar150;
      fVar51 = fVar225 - fVar51;
      fVar75 = fVar225 - fVar75;
      fVar76 = fVar225 - fVar76;
      fVar77 = fVar225 - fVar77;
      fVar78 = fVar151 - fVar78;
      fVar92 = fVar151 - fVar92;
      fVar93 = fVar151 - fVar93;
      fVar94 = fVar151 - fVar94;
      fVar114 = fVar131 - fVar223;
      fVar124 = fVar140 - fVar226;
      fVar126 = fVar145 - fVar228;
      fVar128 = fVar150 - fVar190;
      fVar95 = fVar51 - (float)local_1a78._0_4_;
      fVar108 = fVar75 - (float)local_1a78._4_4_;
      fVar110 = fVar76 - fStack_1a70;
      fVar112 = fVar77 - fStack_1a6c;
      fVar206 = fVar78 - fVar220;
      fVar209 = fVar92 - fVar221;
      fVar212 = fVar93 - fVar222;
      fVar215 = fVar94 - fVar201;
      fVar132 = *(float *)&(This->intersector4_filter).occluded;
      fVar141 = *(float *)((long)&(This->intersector4_filter).occluded + 4);
      fVar142 = *(float *)&(This->intersector4_filter).name;
      fVar143 = *(float *)((long)&(This->intersector4_filter).name + 4);
      ppcVar1 = &(This->intersector4).name;
      auVar25 = *(undefined1 (*) [12])ppcVar1;
      fVar146 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
      fVar147 = *(float *)&(This->intersector4).intersect;
      fVar148 = *(float *)((long)&(This->intersector4).intersect + 4);
      fVar152 = *(float *)&(This->intersector4).occluded;
      fVar153 = *(float *)((long)&(This->intersector4).occluded + 4);
      fVar217 = (fVar95 * (fVar78 + fVar220) - (fVar51 + (float)local_1a78._0_4_) * fVar206) *
                fVar147 + ((fVar131 + fVar223) * fVar206 - (fVar78 + fVar220) * fVar114) *
                          *(float *)ppcVar1 +
                          (fVar114 * (fVar51 + (float)local_1a78._0_4_) -
                          (fVar131 + fVar223) * fVar95) * fVar132;
      fVar218 = (fVar108 * (fVar92 + fVar221) - (fVar75 + (float)local_1a78._4_4_) * fVar209) *
                fVar148 + ((fVar140 + fVar226) * fVar209 - (fVar92 + fVar221) * fVar124) *
                          *(float *)((long)&(This->intersector4).name + 4) +
                          (fVar124 * (fVar75 + (float)local_1a78._4_4_) -
                          (fVar140 + fVar226) * fVar108) * fVar141;
      uStack_1ae0._0_4_ =
           (fVar110 * (fVar93 + fVar222) - (fVar76 + fStack_1a70) * fVar212) * fVar152 +
           ((fVar145 + fVar228) * fVar212 - (fVar93 + fVar222) * fVar126) *
           *(float *)&(This->intersector4_filter).intersect +
           (fVar126 * (fVar76 + fStack_1a70) - (fVar145 + fVar228) * fVar110) * fVar142;
      uStack_1ae0._4_4_ =
           (fVar112 * (fVar94 + fVar201) - (fVar77 + fStack_1a6c) * fVar215) * fVar153 +
           ((fVar150 + fVar190) * fVar215 - (fVar94 + fVar201) * fVar128) * fVar146 +
           (fVar128 * (fVar77 + fStack_1a6c) - (fVar150 + fVar190) * fVar112) * fVar143;
      fVar115 = fVar223 - fVar191;
      fVar125 = fVar226 - fVar194;
      fVar127 = fVar228 - fVar198;
      fVar129 = fVar190 - fVar202;
      fVar176 = (float)local_1a78._0_4_ - fVar130;
      fVar181 = (float)local_1a78._4_4_ - fVar139;
      fVar182 = fStack_1a70 - fVar144;
      fVar183 = fStack_1a6c - fVar149;
      fVar96 = fVar220 - fVar163;
      fVar109 = fVar221 - fVar170;
      fVar111 = fVar222 - fVar171;
      fVar113 = fVar201 - fVar172;
      local_1af8 = auVar25._0_4_;
      fStack_1af4 = auVar25._4_4_;
      fStack_1af0 = auVar25._8_4_;
      fVar207 = (fVar176 * (fVar220 + fVar163) - ((float)local_1a78._0_4_ + fVar130) * fVar96) *
                fVar147 + ((fVar223 + fVar191) * fVar96 - (fVar220 + fVar163) * fVar115) *
                          local_1af8 +
                          (fVar115 * ((float)local_1a78._0_4_ + fVar130) -
                          (fVar223 + fVar191) * fVar176) * fVar132;
      fVar210 = (fVar181 * (fVar221 + fVar170) - ((float)local_1a78._4_4_ + fVar139) * fVar109) *
                fVar148 + ((fVar226 + fVar194) * fVar109 - (fVar221 + fVar170) * fVar125) *
                          fStack_1af4 +
                          (fVar125 * ((float)local_1a78._4_4_ + fVar139) -
                          (fVar226 + fVar194) * fVar181) * fVar141;
      fVar213 = (fVar182 * (fVar222 + fVar171) - (fStack_1a70 + fVar144) * fVar111) * fVar152 +
                ((fVar228 + fVar198) * fVar111 - (fVar222 + fVar171) * fVar127) * fStack_1af0 +
                (fVar127 * (fStack_1a70 + fVar144) - (fVar228 + fVar198) * fVar182) * fVar142;
      fVar216 = (fVar183 * (fVar201 + fVar172) - (fStack_1a6c + fVar149) * fVar113) * fVar153 +
                ((fVar190 + fVar202) * fVar113 - (fVar201 + fVar172) * fVar129) * fVar146 +
                (fVar129 * (fStack_1a6c + fVar149) - (fVar190 + fVar202) * fVar183) * fVar143;
      fVar184 = fVar191 - fVar131;
      fVar187 = fVar194 - fVar140;
      fVar188 = fVar198 - fVar145;
      fVar189 = fVar202 - fVar150;
      fVar192 = fVar130 - fVar51;
      fVar195 = fVar139 - fVar75;
      fVar199 = fVar144 - fVar76;
      fVar203 = fVar149 - fVar77;
      fVar224 = fVar163 - fVar78;
      fVar227 = fVar170 - fVar92;
      fVar229 = fVar171 - fVar93;
      fVar230 = fVar172 - fVar94;
      fVar51 = (fVar192 * (fVar78 + fVar163) - (fVar51 + fVar130) * fVar224) * fVar147 +
               ((fVar131 + fVar191) * fVar224 - (fVar78 + fVar163) * fVar184) * local_1af8 +
               (fVar184 * (fVar51 + fVar130) - (fVar131 + fVar191) * fVar192) * fVar132;
      fVar75 = (fVar195 * (fVar92 + fVar170) - (fVar75 + fVar139) * fVar227) * fVar148 +
               ((fVar140 + fVar194) * fVar227 - (fVar92 + fVar170) * fVar187) * fStack_1af4 +
               (fVar187 * (fVar75 + fVar139) - (fVar140 + fVar194) * fVar195) * fVar141;
      fVar145 = (fVar199 * (fVar93 + fVar171) - (fVar76 + fVar144) * fVar229) * fVar152 +
                ((fVar145 + fVar198) * fVar229 - (fVar93 + fVar171) * fVar188) * fStack_1af0 +
                (fVar188 * (fVar76 + fVar144) - (fVar145 + fVar198) * fVar199) * fVar142;
      fVar150 = (fVar203 * (fVar94 + fVar172) - (fVar77 + fVar149) * fVar230) * fVar153 +
                ((fVar150 + fVar202) * fVar230 - (fVar94 + fVar172) * fVar189) * fVar146 +
                (fVar189 * (fVar77 + fVar149) - (fVar150 + fVar202) * fVar203) * fVar143;
      fVar131 = fVar217 + fVar207 + fVar51;
      fVar140 = fVar218 + fVar210 + fVar75;
      auVar98._0_8_ = CONCAT44(fVar140,fVar131);
      auVar98._8_4_ = (float)uStack_1ae0 + fVar213 + fVar145;
      auVar98._12_4_ = uStack_1ae0._4_4_ + fVar216 + fVar150;
      auVar63._4_4_ = fVar218;
      auVar63._0_4_ = fVar217;
      auVar63._8_4_ = (float)uStack_1ae0;
      auVar63._12_4_ = uStack_1ae0._4_4_;
      auVar8._4_4_ = fVar210;
      auVar8._0_4_ = fVar207;
      auVar8._8_4_ = fVar213;
      auVar8._12_4_ = fVar216;
      auVar157 = minps(auVar63,auVar8);
      auVar11._4_4_ = fVar75;
      auVar11._0_4_ = fVar51;
      auVar11._8_4_ = fVar145;
      auVar11._12_4_ = fVar150;
      auVar157 = minps(auVar157,auVar11);
      local_1ae8 = CONCAT44(fVar218,fVar217);
      auVar166._4_4_ = fVar218;
      auVar166._0_4_ = fVar217;
      auVar166._8_4_ = (float)uStack_1ae0;
      auVar166._12_4_ = uStack_1ae0._4_4_;
      auVar9._4_4_ = fVar210;
      auVar9._0_4_ = fVar207;
      auVar9._8_4_ = fVar213;
      auVar9._12_4_ = fVar216;
      auVar79 = maxps(auVar166,auVar9);
      auVar12._4_4_ = fVar75;
      auVar12._0_4_ = fVar51;
      auVar12._8_4_ = fVar145;
      auVar12._12_4_ = fVar150;
      auVar79 = maxps(auVar79,auVar12);
      fVar131 = ABS(fVar131) * 1.1920929e-07;
      fVar140 = ABS(fVar140) * 1.1920929e-07;
      local_1b58 = auVar86._0_4_;
      uStack_1b54 = auVar86._4_4_;
      uStack_1b50 = auVar86._8_4_;
      uStack_1b4c = auVar86._12_4_;
      auVar167._0_8_ =
           CONCAT44(-(uint)(auVar79._4_4_ <= fVar140 || -fVar140 <= auVar157._4_4_) & uStack_1b54,
                    -(uint)(auVar79._0_4_ <= fVar131 || -fVar131 <= auVar157._0_4_) & local_1b58);
      auVar167._8_4_ =
           -(uint)(auVar79._8_4_ <= ABS(auVar98._8_4_) * 1.1920929e-07 ||
                  -(ABS(auVar98._8_4_) * 1.1920929e-07) <= auVar157._8_4_) & uStack_1b50;
      auVar167._12_4_ =
           -(uint)(auVar79._12_4_ <= ABS(auVar98._12_4_) * 1.1920929e-07 ||
                  -(ABS(auVar98._12_4_) * 1.1920929e-07) <= auVar157._12_4_) & uStack_1b4c;
      iVar33 = movmskps((int)local_1a80,auVar167);
      if (iVar33 == 0) {
        auVar161._8_4_ = auVar167._8_4_;
        auVar161._0_8_ = auVar167._0_8_;
        auVar161._12_4_ = auVar167._12_4_;
      }
      else {
        auVar134._0_4_ = fVar95 * fVar96 - fVar176 * fVar206;
        auVar134._4_4_ = fVar108 * fVar109 - fVar181 * fVar209;
        auVar134._8_4_ = fVar110 * fVar111 - fVar182 * fVar212;
        auVar134._12_4_ = fVar112 * fVar113 - fVar183 * fVar215;
        auVar177._0_4_ = fVar176 * fVar224 - fVar192 * fVar96;
        auVar177._4_4_ = fVar181 * fVar227 - fVar195 * fVar109;
        auVar177._8_4_ = fVar182 * fVar229 - fVar199 * fVar111;
        auVar177._12_4_ = fVar183 * fVar230 - fVar203 * fVar113;
        auVar64._4_4_ = -(uint)(ABS(fVar181 * fVar209) < ABS(fVar195 * fVar109));
        auVar64._0_4_ = -(uint)(ABS(fVar176 * fVar206) < ABS(fVar192 * fVar96));
        auVar64._8_4_ = -(uint)(ABS(fVar182 * fVar212) < ABS(fVar199 * fVar111));
        auVar64._12_4_ = -(uint)(ABS(fVar183 * fVar215) < ABS(fVar203 * fVar113));
        auVar178 = blendvps(auVar177,auVar134,auVar64);
        auVar174._0_4_ = fVar206 * fVar115 - fVar114 * fVar96;
        auVar174._4_4_ = fVar209 * fVar125 - fVar124 * fVar109;
        auVar174._8_4_ = fVar212 * fVar127 - fVar126 * fVar111;
        auVar174._12_4_ = fVar215 * fVar129 - fVar128 * fVar113;
        auVar185._0_4_ = fVar184 * fVar96 - fVar115 * fVar224;
        auVar185._4_4_ = fVar187 * fVar109 - fVar125 * fVar227;
        auVar185._8_4_ = fVar188 * fVar111 - fVar127 * fVar229;
        auVar185._12_4_ = fVar189 * fVar113 - fVar129 * fVar230;
        auVar65._4_4_ = -(uint)(ABS(fVar124 * fVar109) < ABS(fVar125 * fVar227));
        auVar65._0_4_ = -(uint)(ABS(fVar114 * fVar96) < ABS(fVar115 * fVar224));
        auVar65._8_4_ = -(uint)(ABS(fVar126 * fVar111) < ABS(fVar127 * fVar229));
        auVar65._12_4_ = -(uint)(ABS(fVar128 * fVar113) < ABS(fVar129 * fVar230));
        auVar186 = blendvps(auVar185,auVar174,auVar65);
        auVar118._0_4_ = fVar115 * fVar192 - fVar184 * fVar176;
        auVar118._4_4_ = fVar125 * fVar195 - fVar187 * fVar181;
        auVar118._8_4_ = fVar127 * fVar199 - fVar188 * fVar182;
        auVar118._12_4_ = fVar129 * fVar203 - fVar189 * fVar183;
        auVar66._4_4_ = -(uint)(ABS(fVar125 * fVar108) < ABS(fVar187 * fVar181));
        auVar66._0_4_ = -(uint)(ABS(fVar115 * fVar95) < ABS(fVar184 * fVar176));
        auVar66._8_4_ = -(uint)(ABS(fVar127 * fVar110) < ABS(fVar188 * fVar182));
        auVar66._12_4_ = -(uint)(ABS(fVar129 * fVar112) < ABS(fVar189 * fVar183));
        auVar10._4_4_ = fVar124 * fVar181 - fVar125 * fVar108;
        auVar10._0_4_ = fVar114 * fVar176 - fVar115 * fVar95;
        auVar10._8_4_ = fVar126 * fVar182 - fVar127 * fVar110;
        auVar10._12_4_ = fVar128 * fVar183 - fVar129 * fVar112;
        auVar79 = blendvps(auVar118,auVar10,auVar66);
        fVar131 = fVar147 * auVar178._0_4_ + local_1af8 * auVar186._0_4_ + fVar132 * auVar79._0_4_;
        fVar140 = fVar148 * auVar178._4_4_ + fStack_1af4 * auVar186._4_4_ + fVar141 * auVar79._4_4_;
        fVar145 = fVar152 * auVar178._8_4_ + fStack_1af0 * auVar186._8_4_ + fVar142 * auVar79._8_4_;
        fVar150 = fVar153 * auVar178._12_4_ + fVar146 * auVar186._12_4_ + fVar143 * auVar79._12_4_;
        auVar159._0_4_ = fVar131 + fVar131;
        auVar159._4_4_ = fVar140 + fVar140;
        auVar159._8_4_ = fVar145 + fVar145;
        auVar159._12_4_ = fVar150 + fVar150;
        auVar83._0_4_ = fVar220 * auVar79._0_4_;
        auVar83._4_4_ = fVar221 * auVar79._4_4_;
        auVar83._8_4_ = fVar222 * auVar79._8_4_;
        auVar83._12_4_ = fVar201 * auVar79._12_4_;
        fVar145 = fVar223 * auVar178._0_4_ +
                  (float)local_1a78._0_4_ * auVar186._0_4_ + auVar83._0_4_;
        fVar150 = fVar226 * auVar178._4_4_ +
                  (float)local_1a78._4_4_ * auVar186._4_4_ + auVar83._4_4_;
        fVar51 = fVar228 * auVar178._8_4_ + fStack_1a70 * auVar186._8_4_ + auVar83._8_4_;
        fVar75 = fVar190 * auVar178._12_4_ + fStack_1a6c * auVar186._12_4_ + auVar83._12_4_;
        auVar157 = rcpps(auVar83,auVar159);
        fVar190 = auVar157._0_4_;
        fVar201 = auVar157._4_4_;
        fVar131 = auVar157._8_4_;
        fVar140 = auVar157._12_4_;
        fVar190 = ((1.0 - auVar159._0_4_ * fVar190) * fVar190 + fVar190) * (fVar145 + fVar145);
        fVar201 = ((1.0 - auVar159._4_4_ * fVar201) * fVar201 + fVar201) * (fVar150 + fVar150);
        fVar131 = ((1.0 - auVar159._8_4_ * fVar131) * fVar131 + fVar131) * (fVar51 + fVar51);
        fVar140 = ((1.0 - auVar159._12_4_ * fVar140) * fVar140 + fVar140) * (fVar75 + fVar75);
        auVar160._0_4_ =
             (int)((uint)(auVar159._0_4_ != 0.0 &&
                         (fVar190 <= *(float *)&(This->intersector4_nofilter).name &&
                         *(float *)&(This->intersector1).pointQuery <= fVar190)) * -0x80000000) >>
             0x1f;
        auVar160._4_4_ =
             (int)((uint)(auVar159._4_4_ != 0.0 &&
                         (fVar201 <= *(float *)((long)&(This->intersector4_nofilter).name + 4) &&
                         *(float *)((long)&(This->intersector1).pointQuery + 4) <= fVar201)) *
                  -0x80000000) >> 0x1f;
        auVar160._8_4_ =
             (int)((uint)(auVar159._8_4_ != 0.0 &&
                         (fVar131 <= *(float *)&(This->intersector8).intersect &&
                         *(float *)&(This->intersector1).name <= fVar131)) * -0x80000000) >> 0x1f;
        auVar160._12_4_ =
             (int)((uint)(auVar159._12_4_ != 0.0 &&
                         (fVar140 <= *(float *)((long)&(This->intersector8).intersect + 4) &&
                         *(float *)((long)&(This->intersector1).name + 4) <= fVar140)) * -0x80000000
                  ) >> 0x1f;
        auVar161 = auVar160 & auVar167;
        iVar33 = movmskps(iVar33,auVar161);
        if (iVar33 != 0) {
          local_1718 = local_1ae8;
          uStack_1710 = uStack_1ae0;
          uStack_19f0 = auVar98._8_8_;
          uStack_1730 = uStack_19f0;
          local_1778 = auVar79;
          local_1768 = auVar186;
          local_1758 = auVar178;
          local_1748 = fVar190;
          fStack_1744 = fVar201;
          fStack_1740 = fVar131;
          fStack_173c = fVar140;
          local_1738 = auVar98._0_8_;
          local_1728 = fVar207;
          fStack_1724 = fVar210;
          fStack_1720 = fVar213;
          fStack_171c = fVar216;
        }
      }
      auVar180._4_4_ = fVar225;
      auVar180._0_4_ = fVar225;
      auVar180._8_4_ = fVar225;
      auVar180._12_4_ = fVar225;
      fVar190 = *(float *)(local_1a90 + lVar41);
      fVar201 = *(float *)(local_1a88 + lVar41);
      fVar131 = *(float *)(local_1a80 + lVar41);
      uVar29 = *(uint *)(pre.super_Precalculations.grid + 0x18);
      lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)uVar29 * 8);
      uVar196 = *(uint *)(lVar3 + 0x34);
      auVar84._0_4_ = -(uint)((uVar196 & *(uint *)&(This->intersector8).occluded) == 0);
      auVar84._4_4_ = -(uint)((uVar196 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
      auVar84._8_4_ = -(uint)((uVar196 & *(uint *)&(This->intersector8).name) == 0);
      auVar84._12_4_ = -(uint)((uVar196 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
      auVar85 = ~auVar84 & auVar161;
      iVar33 = movmskps((int)*(long *)(*(long *)ray + 0x1e8),auVar85);
      if (iVar33 != 0) {
        uVar34 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
        if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) || (*(long *)(lVar3 + 0x48) != 0)) {
          auVar24._8_8_ = uStack_1730;
          auVar24._0_8_ = local_1738;
          fVar75 = (float)((ulong)local_1738 >> 0x20);
          fVar76 = (float)((ulong)uStack_1730 >> 0x20);
          auVar157 = rcpps(_DAT_01fec6c0,auVar24);
          fVar140 = auVar157._0_4_;
          fVar145 = auVar157._4_4_;
          fVar150 = auVar157._8_4_;
          fVar51 = auVar157._12_4_;
          fVar140 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_1738 & (uint)DAT_01fec6c0))
                           & (uint)(((float)DAT_01feca10 - (float)local_1738 * fVar140) * fVar140 +
                                   fVar140));
          fVar145 = (float)(-(uint)(1e-18 <= (float)((uint)fVar75 & DAT_01fec6c0._4_4_)) &
                           (uint)((DAT_01feca10._4_4_ - fVar75 * fVar145) * fVar145 + fVar145));
          fVar150 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_1730 & DAT_01fec6c0._8_4_))
                           & (uint)((DAT_01feca10._8_4_ - (float)uStack_1730 * fVar150) * fVar150 +
                                   fVar150));
          fVar51 = (float)(-(uint)(1e-18 <= (float)((uint)fVar76 & DAT_01fec6c0._12_4_)) &
                          (uint)((DAT_01feca10._12_4_ - fVar76 * fVar51) * fVar51 + fVar51));
          auVar71._0_4_ = (float)local_1718 * fVar140;
          auVar71._4_4_ = local_1718._4_4_ * fVar145;
          auVar71._8_4_ = (float)uStack_1710 * fVar150;
          auVar71._12_4_ = uStack_1710._4_4_ * fVar51;
          auVar157 = minps(auVar71,_DAT_01feca10);
          auVar100._0_4_ = fVar140 * local_1728;
          auVar100._4_4_ = fVar145 * fStack_1724;
          auVar100._8_4_ = fVar150 * fStack_1720;
          auVar100._12_4_ = fVar51 * fStack_171c;
          auVar79 = minps(auVar100,_DAT_01feca10);
          uVar196 = *(uint *)(local_1a98 + lVar41 + -4);
          auVar137._4_4_ = uVar196;
          auVar137._0_4_ = uVar196;
          auVar137._8_4_ = uVar196;
          auVar137._12_4_ = uVar196;
          uVar200 = *(uint *)(pGVar48 + lVar41);
          auVar122._4_4_ = uVar200;
          auVar122._0_4_ = uVar200;
          auVar122._8_4_ = uVar200;
          auVar122._12_4_ = uVar200;
          auVar178 = pblendw(auVar137,(undefined1  [16])0x0,0xaa);
          fVar141 = (float)DAT_0201c970;
          fVar142 = DAT_0201c970._4_4_;
          fVar143 = DAT_0201c970._8_4_;
          fVar146 = DAT_0201c970._12_4_;
          fVar140 = auVar157._0_4_;
          fVar145 = auVar157._4_4_;
          fVar150 = auVar157._8_4_;
          fVar51 = auVar157._12_4_;
          fVar75 = auVar79._0_4_;
          fVar92 = ((float)DAT_01feca10 - fVar140) - fVar75;
          fVar76 = auVar79._4_4_;
          fVar93 = (DAT_01feca10._4_4_ - fVar145) - fVar76;
          fVar77 = auVar79._8_4_;
          fVar94 = (DAT_01feca10._8_4_ - fVar150) - fVar77;
          fVar78 = auVar79._12_4_;
          fVar132 = (DAT_01feca10._12_4_ - fVar51) - fVar78;
          auVar79 = pblendw(auVar122,(undefined1  [16])0x0,0xaa);
          uVar204 = *(uint *)(local_1a98 + lVar41);
          auVar101._4_4_ = uVar204;
          auVar101._0_4_ = uVar204;
          auVar101._8_4_ = uVar204;
          auVar101._12_4_ = uVar204;
          auVar157 = pblendw(auVar101,(undefined1  [16])0x0,0xaa);
          local_1938 = (float)auVar157._0_4_ * fVar141 * fVar140 +
                       (float)auVar79._0_4_ * fVar141 * fVar75 +
                       (float)auVar178._0_4_ * fVar141 * fVar92;
          fStack_1934 = (float)auVar157._4_4_ * fVar142 * fVar145 +
                        (float)auVar79._4_4_ * fVar142 * fVar76 +
                        (float)auVar178._4_4_ * fVar142 * fVar93;
          fStack_1930 = (float)auVar157._8_4_ * fVar143 * fVar150 +
                        (float)auVar79._8_4_ * fVar143 * fVar77 +
                        (float)auVar178._8_4_ * fVar143 * fVar94;
          fStack_192c = (float)auVar157._12_4_ * fVar146 * fVar51 +
                        (float)auVar79._12_4_ * fVar146 * fVar78 +
                        (float)auVar178._12_4_ * fVar146 * fVar132;
          local_1928 = (float)(uVar204 >> 0x10) * fVar141 * fVar140 +
                       (float)(uVar200 >> 0x10) * fVar141 * fVar75 +
                       fVar92 * (float)(uVar196 >> 0x10) * fVar141;
          fStack_1924 = (float)(uVar204 >> 0x10) * fVar142 * fVar145 +
                        (float)(uVar200 >> 0x10) * fVar142 * fVar76 +
                        fVar93 * (float)(uVar196 >> 0x10) * fVar142;
          fStack_1920 = (float)(uVar204 >> 0x10) * fVar143 * fVar150 +
                        (float)(uVar200 >> 0x10) * fVar143 * fVar77 +
                        fVar94 * (float)(uVar196 >> 0x10) * fVar143;
          fStack_191c = (float)(uVar204 >> 0x10) * fVar146 * fVar51 +
                        (float)(uVar200 >> 0x10) * fVar146 * fVar78 +
                        fVar132 * (float)(uVar196 >> 0x10) * fVar146;
          local_1968 = local_1758._0_8_;
          uStack_1960 = local_1758._8_8_;
          local_1958 = local_1768._0_8_;
          uStack_1950 = local_1768._8_8_;
          local_1948 = local_1778;
          local_18f8 = **(undefined4 **)(ray + 8);
          local_18e8 = (*(undefined4 **)(ray + 8))[1];
          _local_1a78 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
          auVar23._4_4_ = fStack_1744;
          auVar23._0_4_ = local_1748;
          auVar23._8_4_ = fStack_1740;
          auVar23._12_4_ = fStack_173c;
          auVar157 = blendvps(_local_1a78,auVar23,auVar85);
          *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar157;
          args.valid = (int *)local_1ab8;
          args.geometryUserPtr = *(void **)(lVar3 + 0x18);
          args.context = *(RTCRayQueryContext **)(ray + 8);
          args.hit = (RTCHitN *)&local_1968;
          args.N = 4;
          pRVar32 = *(RTCRayN **)(lVar3 + 0x48);
          local_1ab8 = auVar85;
          args.ray = (RTCRayN *)This;
          local_1918 = uVar34;
          uStack_1914 = uVar34;
          uStack_1910 = uVar34;
          uStack_190c = uVar34;
          local_1908 = uVar29;
          uStack_1904 = uVar29;
          uStack_1900 = uVar29;
          uStack_18fc = uVar29;
          uStack_18f4 = local_18f8;
          uStack_18f0 = local_18f8;
          uStack_18ec = local_18f8;
          uStack_18e4 = local_18e8;
          uStack_18e0 = local_18e8;
          uStack_18dc = local_18e8;
          if (pRVar32 != (RTCRayN *)0x0) {
            pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
          }
          if (local_1ab8 == (undefined1  [16])0x0) {
            auVar102._8_4_ = 0xffffffff;
            auVar102._0_8_ = 0xffffffffffffffff;
            auVar102._12_4_ = 0xffffffff;
            auVar102 = auVar102 ^ _DAT_01febe20;
          }
          else {
            pcVar7 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
            if ((pcVar7 != (code *)0x0) &&
               (((**(byte **)(ray + 0x10) & 2) != 0 || ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))) {
              (*pcVar7)(&args);
            }
            auVar72._0_4_ = -(uint)(local_1ab8._0_4_ == 0);
            auVar72._4_4_ = -(uint)(local_1ab8._4_4_ == 0);
            auVar72._8_4_ = -(uint)(local_1ab8._8_4_ == 0);
            auVar72._12_4_ = -(uint)(local_1ab8._12_4_ == 0);
            auVar102 = auVar72 ^ _DAT_01febe20;
            auVar157 = blendvps((undefined1  [16])_DAT_01feba00,
                                *(undefined1 (*) [16])(args.ray + 0x80),auVar72);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar157;
            pRVar32 = args.ray;
          }
          uVar29 = (uint)pRVar32;
          auVar106._0_4_ = auVar102._0_4_ << 0x1f;
          auVar106._4_4_ = auVar102._4_4_ << 0x1f;
          auVar106._8_4_ = auVar102._8_4_ << 0x1f;
          auVar106._12_4_ = auVar102._12_4_ << 0x1f;
          auVar85._0_4_ = auVar106._0_4_ >> 0x1f;
          auVar85._4_4_ = auVar106._4_4_ >> 0x1f;
          auVar85._8_4_ = auVar106._8_4_ >> 0x1f;
          auVar85._12_4_ = auVar106._12_4_ >> 0x1f;
          auVar157 = blendvps(_local_1a78,*(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                              auVar106);
          *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar157;
        }
        auVar86 = ~auVar85 & auVar86;
      }
      uVar29 = movmskps(uVar29,auVar86);
      pGVar31 = (GridSOA *)(ulong)uVar29;
      if (uVar29 == 0) {
        fVar190 = INFINITY;
        fVar193 = INFINITY;
        fVar197 = INFINITY;
        fVar201 = INFINITY;
        break;
      }
      fVar225 = *(float *)&This->ptr;
      fVar140 = *(float *)((long)&This->ptr + 4);
      fVar145 = *(float *)&This->leafIntersector;
      fVar150 = *(float *)((long)&This->leafIntersector + 4);
      fVar51 = *(float *)&(This->collider).collide;
      fVar75 = *(float *)((long)&(This->collider).collide + 4);
      fVar76 = *(float *)&(This->collider).name;
      fVar77 = *(float *)((long)&(This->collider).name + 4);
      fVar78 = *(float *)&(This->intersector1).intersect;
      fVar92 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar93 = *(float *)&(This->intersector1).occluded;
      fVar94 = *(float *)((long)&(This->intersector1).occluded + 4);
      p_Var17 = (This->intersector4).intersect;
      p_Var18 = (This->intersector4).occluded;
      ppcVar1 = &(This->intersector4).name;
      pcVar19 = *ppcVar1;
      p_Var20 = (This->intersector4_filter).intersect;
      auVar25 = *(undefined1 (*) [12])ppcVar1;
      local_1b08 = SUB84(pcVar19,0);
      fStack_1b04 = (float)((ulong)pcVar19 >> 0x20);
      fStack_1b00 = SUB84(p_Var20,0);
      fStack_1afc = (float)((ulong)p_Var20 >> 0x20);
      fVar188 = fVar219 - fVar225;
      fVar192 = fVar219 - fVar140;
      fVar198 = fVar219 - fVar145;
      fVar219 = fVar219 - fVar150;
      fVar149 = auVar180._0_4_ - fVar51;
      fVar163 = auVar180._4_4_ - fVar75;
      fVar170 = auVar180._8_4_ - fVar76;
      fVar171 = auVar180._12_4_ - fVar77;
      fVar132 = fVar151 - fVar78;
      fVar141 = fVar151 - fVar92;
      fVar146 = fVar151 - fVar93;
      fVar151 = fVar151 - fVar94;
      fVar183 = fVar193 - fVar225;
      fVar184 = fVar193 - fVar140;
      fVar187 = fVar193 - fVar145;
      fVar193 = fVar193 - fVar150;
      fVar189 = fVar197 - fVar51;
      fVar194 = fVar197 - fVar75;
      fVar199 = fVar197 - fVar76;
      fVar197 = fVar197 - fVar77;
      fVar95 = fVar156 - fVar78;
      fVar96 = fVar156 - fVar92;
      fVar108 = fVar156 - fVar93;
      fVar156 = fVar156 - fVar94;
      fVar225 = fVar190 - fVar225;
      fVar140 = fVar190 - fVar140;
      fVar145 = fVar190 - fVar145;
      fVar190 = fVar190 - fVar150;
      fVar51 = fVar201 - fVar51;
      fVar75 = fVar201 - fVar75;
      fVar76 = fVar201 - fVar76;
      fVar201 = fVar201 - fVar77;
      fVar78 = fVar131 - fVar78;
      fVar92 = fVar131 - fVar92;
      fVar93 = fVar131 - fVar93;
      fVar131 = fVar131 - fVar94;
      fVar109 = fVar225 - fVar188;
      fVar111 = fVar140 - fVar192;
      fVar113 = fVar145 - fVar198;
      fVar115 = fVar190 - fVar219;
      fVar206 = fVar51 - fVar149;
      fVar209 = fVar75 - fVar163;
      fVar212 = fVar76 - fVar170;
      fVar215 = fVar201 - fVar171;
      local_1a78._0_4_ = fVar78 - fVar132;
      local_1a78._4_4_ = fVar92 - fVar141;
      fStack_1a70 = fVar93 - fVar146;
      fStack_1a6c = fVar131 - fVar151;
      pp_Var2 = &(This->intersector4_filter).occluded;
      auVar26 = *(undefined1 (*) [12])pp_Var2;
      fVar150 = *(float *)((long)&(This->intersector4_filter).name + 4);
      fVar125 = fVar188 - fVar183;
      fVar126 = fVar192 - fVar184;
      fVar127 = fVar198 - fVar187;
      fVar128 = fVar219 - fVar193;
      fVar77 = fVar149 - fVar189;
      fVar142 = fVar163 - fVar194;
      fVar147 = fVar170 - fVar199;
      fVar152 = fVar171 - fVar197;
      local_1ad8 = SUB84(p_Var17,0);
      fStack_1ad4 = (float)((ulong)p_Var17 >> 0x20);
      fStack_1ad0 = SUB84(p_Var18,0);
      fStack_1acc = (float)((ulong)p_Var18 >> 0x20);
      fVar172 = (fVar206 * (fVar78 + fVar132) - (fVar51 + fVar149) * (float)local_1a78._0_4_) *
                local_1ad8 +
                ((fVar225 + fVar188) * (float)local_1a78._0_4_ - (fVar78 + fVar132) * fVar109) *
                local_1b08 +
                (fVar109 * (fVar51 + fVar149) - (fVar225 + fVar188) * fVar206) * *(float *)pp_Var2;
      fVar176 = (fVar209 * (fVar92 + fVar141) - (fVar75 + fVar163) * (float)local_1a78._4_4_) *
                fStack_1ad4 +
                ((fVar140 + fVar192) * (float)local_1a78._4_4_ - (fVar92 + fVar141) * fVar111) *
                fStack_1b04 +
                (fVar111 * (fVar75 + fVar163) - (fVar140 + fVar192) * fVar209) *
                *(float *)((long)&(This->intersector4_filter).occluded + 4);
      fVar181 = (fVar212 * (fVar93 + fVar146) - (fVar76 + fVar170) * fStack_1a70) * fStack_1ad0 +
                ((fVar145 + fVar198) * fStack_1a70 - (fVar93 + fVar146) * fVar113) * fStack_1b00 +
                (fVar113 * (fVar76 + fVar170) - (fVar145 + fVar198) * fVar212) *
                *(float *)&(This->intersector4_filter).name;
      fVar182 = (fVar215 * (fVar131 + fVar151) - (fVar201 + fVar171) * fStack_1a6c) * fStack_1acc +
                ((fVar190 + fVar219) * fStack_1a6c - (fVar131 + fVar151) * fVar115) * fStack_1afc +
                (fVar115 * (fVar201 + fVar171) - (fVar190 + fVar219) * fVar215) * fVar150;
      fVar110 = fVar132 - fVar95;
      fVar112 = fVar141 - fVar96;
      fVar114 = fVar146 - fVar108;
      fVar124 = fVar151 - fVar156;
      local_1af8 = auVar26._0_4_;
      fStack_1af4 = auVar26._4_4_;
      fStack_1af0 = auVar26._8_4_;
      fVar207 = (fVar77 * (fVar132 + fVar95) - (fVar149 + fVar189) * fVar110) * local_1ad8 +
                ((fVar188 + fVar183) * fVar110 - (fVar132 + fVar95) * fVar125) * auVar25._0_4_ +
                (fVar125 * (fVar149 + fVar189) - (fVar188 + fVar183) * fVar77) * local_1af8;
      fVar210 = (fVar142 * (fVar141 + fVar96) - (fVar163 + fVar194) * fVar112) * fStack_1ad4 +
                ((fVar192 + fVar184) * fVar112 - (fVar141 + fVar96) * fVar126) * auVar25._4_4_ +
                (fVar126 * (fVar163 + fVar194) - (fVar192 + fVar184) * fVar142) * fStack_1af4;
      fVar213 = (fVar147 * (fVar146 + fVar108) - (fVar170 + fVar199) * fVar114) * fStack_1ad0 +
                ((fVar198 + fVar187) * fVar114 - (fVar146 + fVar108) * fVar127) * auVar25._8_4_ +
                (fVar127 * (fVar170 + fVar199) - (fVar198 + fVar187) * fVar147) * fStack_1af0;
      fVar216 = (fVar152 * (fVar151 + fVar156) - (fVar171 + fVar197) * fVar124) * fStack_1acc +
                ((fVar219 + fVar193) * fVar124 - (fVar151 + fVar156) * fVar128) * fStack_1afc +
                (fVar128 * (fVar171 + fVar197) - (fVar219 + fVar193) * fVar152) * fVar150;
      fVar129 = fVar183 - fVar225;
      fVar130 = fVar184 - fVar140;
      fVar139 = fVar187 - fVar145;
      fVar144 = fVar193 - fVar190;
      fVar94 = fVar189 - fVar51;
      fVar143 = fVar194 - fVar75;
      fVar148 = fVar199 - fVar76;
      fVar153 = fVar197 - fVar201;
      fVar191 = fVar95 - fVar78;
      fVar195 = fVar96 - fVar92;
      fVar202 = fVar108 - fVar93;
      fVar203 = fVar156 - fVar131;
      auVar67._0_4_ =
           (fVar94 * (fVar78 + fVar95) - (fVar51 + fVar189) * fVar191) * local_1ad8 +
           ((fVar225 + fVar183) * fVar191 - (fVar78 + fVar95) * fVar129) * auVar25._0_4_ +
           (fVar129 * (fVar51 + fVar189) - (fVar225 + fVar183) * fVar94) * local_1af8;
      auVar67._4_4_ =
           (fVar143 * (fVar92 + fVar96) - (fVar75 + fVar194) * fVar195) * fStack_1ad4 +
           ((fVar140 + fVar184) * fVar195 - (fVar92 + fVar96) * fVar130) * auVar25._4_4_ +
           (fVar130 * (fVar75 + fVar194) - (fVar140 + fVar184) * fVar143) * fStack_1af4;
      auVar67._8_4_ =
           (fVar148 * (fVar93 + fVar108) - (fVar76 + fVar199) * fVar202) * fStack_1ad0 +
           ((fVar145 + fVar187) * fVar202 - (fVar93 + fVar108) * fVar139) * auVar25._8_4_ +
           (fVar139 * (fVar76 + fVar199) - (fVar145 + fVar187) * fVar148) * fStack_1af0;
      auVar67._12_4_ =
           (fVar153 * (fVar131 + fVar156) - (fVar201 + fVar197) * fVar203) * fStack_1acc +
           ((fVar190 + fVar193) * fVar203 - (fVar131 + fVar156) * fVar144) * fStack_1afc +
           (fVar144 * (fVar201 + fVar197) - (fVar190 + fVar193) * fVar153) * fVar150;
      fVar190 = fVar172 + fVar207 + auVar67._0_4_;
      fVar193 = fVar176 + fVar210 + auVar67._4_4_;
      auVar99._0_8_ = CONCAT44(fVar193,fVar190);
      auVar99._8_4_ = fVar181 + fVar213 + auVar67._8_4_;
      auVar99._12_4_ = fVar182 + fVar216 + auVar67._12_4_;
      auVar87._4_4_ = fVar176;
      auVar87._0_4_ = fVar172;
      auVar87._8_4_ = fVar181;
      auVar87._12_4_ = fVar182;
      auVar13._4_4_ = fVar210;
      auVar13._0_4_ = fVar207;
      auVar13._8_4_ = fVar213;
      auVar13._12_4_ = fVar216;
      auVar157 = minps(auVar87,auVar13);
      auVar157 = minps(auVar157,auVar67);
      auVar135._4_4_ = fVar176;
      auVar135._0_4_ = fVar172;
      auVar135._8_4_ = fVar181;
      auVar135._12_4_ = fVar182;
      auVar14._4_4_ = fVar210;
      auVar14._0_4_ = fVar207;
      auVar14._8_4_ = fVar213;
      auVar14._12_4_ = fVar216;
      auVar79 = maxps(auVar135,auVar14);
      auVar79 = maxps(auVar79,auVar67);
      fVar190 = ABS(fVar190) * 1.1920929e-07;
      fVar193 = ABS(fVar193) * 1.1920929e-07;
      local_1b58 = auVar86._0_4_;
      uStack_1b54 = auVar86._4_4_;
      uStack_1b50 = auVar86._8_4_;
      uStack_1b4c = auVar86._12_4_;
      auVar136._0_8_ =
           CONCAT44(-(uint)(auVar79._4_4_ <= fVar193 || -fVar193 <= auVar157._4_4_) & uStack_1b54,
                    -(uint)(auVar79._0_4_ <= fVar190 || -fVar190 <= auVar157._0_4_) & local_1b58);
      auVar136._8_4_ =
           -(uint)(auVar79._8_4_ <= ABS(auVar99._8_4_) * 1.1920929e-07 ||
                  -(ABS(auVar99._8_4_) * 1.1920929e-07) <= auVar157._8_4_) & uStack_1b50;
      auVar136._12_4_ =
           -(uint)(auVar79._12_4_ <= ABS(auVar99._12_4_) * 1.1920929e-07 ||
                  -(ABS(auVar99._12_4_) * 1.1920929e-07) <= auVar157._12_4_) & uStack_1b4c;
      iVar33 = movmskps(uVar29,auVar136);
      uVar29 = (uint)DAT_01fec6c0;
      uVar196 = DAT_01fec6c0._4_4_;
      uVar200 = DAT_01fec6c0._8_4_;
      uVar204 = DAT_01fec6c0._12_4_;
      if (iVar33 == 0) {
        auVar121._8_4_ = auVar136._8_4_;
        auVar121._0_8_ = auVar136._0_8_;
        auVar121._12_4_ = auVar136._12_4_;
      }
      else {
        auVar179._0_4_ = fVar206 * fVar110 - fVar77 * (float)local_1a78._0_4_;
        auVar179._4_4_ = fVar209 * fVar112 - fVar142 * (float)local_1a78._4_4_;
        auVar179._8_4_ = fVar212 * fVar114 - fVar147 * fStack_1a70;
        auVar179._12_4_ = fVar215 * fVar124 - fVar152 * fStack_1a6c;
        auVar168._0_4_ = fVar77 * fVar191 - fVar94 * fVar110;
        auVar168._4_4_ = fVar142 * fVar195 - fVar143 * fVar112;
        auVar168._8_4_ = fVar147 * fVar202 - fVar148 * fVar114;
        auVar168._12_4_ = fVar152 * fVar203 - fVar153 * fVar124;
        auVar68._4_4_ =
             -(uint)((float)((uint)(fVar142 * (float)local_1a78._4_4_) & uVar196) <
                    (float)((uint)(fVar143 * fVar112) & uVar196));
        auVar68._0_4_ =
             -(uint)((float)((uint)(fVar77 * (float)local_1a78._0_4_) & uVar29) <
                    (float)((uint)(fVar94 * fVar110) & uVar29));
        auVar68._8_4_ =
             -(uint)((float)((uint)(fVar147 * fStack_1a70) & uVar200) <
                    (float)((uint)(fVar148 * fVar114) & uVar200));
        auVar68._12_4_ =
             -(uint)((float)((uint)(fVar152 * fStack_1a6c) & uVar204) <
                    (float)((uint)(fVar153 * fVar124) & uVar204));
        auVar178 = blendvps(auVar168,auVar179,auVar68);
        auVar175._0_4_ = fVar129 * fVar110 - fVar125 * fVar191;
        auVar175._4_4_ = fVar130 * fVar112 - fVar126 * fVar195;
        auVar175._8_4_ = fVar139 * fVar114 - fVar127 * fVar202;
        auVar175._12_4_ = fVar144 * fVar124 - fVar128 * fVar203;
        auVar69._4_4_ =
             -(uint)((float)((uint)(fVar111 * fVar112) & uVar196) <
                    (float)((uint)(fVar126 * fVar195) & uVar196));
        auVar69._0_4_ =
             -(uint)((float)((uint)(fVar109 * fVar110) & uVar29) <
                    (float)((uint)(fVar125 * fVar191) & uVar29));
        auVar69._8_4_ =
             -(uint)((float)((uint)(fVar113 * fVar114) & uVar200) <
                    (float)((uint)(fVar127 * fVar202) & uVar200));
        auVar69._12_4_ =
             -(uint)((float)((uint)(fVar115 * fVar124) & uVar204) <
                    (float)((uint)(fVar128 * fVar203) & uVar204));
        auVar15._4_4_ = (float)local_1a78._4_4_ * fVar126 - fVar111 * fVar112;
        auVar15._0_4_ = (float)local_1a78._0_4_ * fVar125 - fVar109 * fVar110;
        auVar15._8_4_ = fStack_1a70 * fVar127 - fVar113 * fVar114;
        auVar15._12_4_ = fStack_1a6c * fVar128 - fVar115 * fVar124;
        auVar186 = blendvps(auVar175,auVar15,auVar69);
        auVar162._0_4_ = fVar125 * fVar94 - fVar129 * fVar77;
        auVar162._4_4_ = fVar126 * fVar143 - fVar130 * fVar142;
        auVar162._8_4_ = fVar127 * fVar148 - fVar139 * fVar147;
        auVar162._12_4_ = fVar128 * fVar153 - fVar144 * fVar152;
        auVar70._4_4_ =
             -(uint)((float)((uint)(fVar126 * fVar209) & uVar196) <
                    (float)((uint)(fVar130 * fVar142) & uVar196));
        auVar70._0_4_ =
             -(uint)((float)((uint)(fVar125 * fVar206) & uVar29) <
                    (float)((uint)(fVar129 * fVar77) & uVar29));
        auVar70._8_4_ =
             -(uint)((float)((uint)(fVar127 * fVar212) & uVar200) <
                    (float)((uint)(fVar139 * fVar147) & uVar200));
        auVar70._12_4_ =
             -(uint)((float)((uint)(fVar128 * fVar215) & uVar204) <
                    (float)((uint)(fVar144 * fVar152) & uVar204));
        auVar16._4_4_ = fVar111 * fVar142 - fVar126 * fVar209;
        auVar16._0_4_ = fVar109 * fVar77 - fVar125 * fVar206;
        auVar16._8_4_ = fVar113 * fVar147 - fVar127 * fVar212;
        auVar16._12_4_ = fVar115 * fVar152 - fVar128 * fVar215;
        auVar79 = blendvps(auVar162,auVar16,auVar70);
        fVar190 = local_1ad8 * auVar178._0_4_ +
                  local_1b08 * auVar186._0_4_ + local_1af8 * auVar79._0_4_;
        fVar193 = fStack_1ad4 * auVar178._4_4_ +
                  fStack_1b04 * auVar186._4_4_ + fStack_1af4 * auVar79._4_4_;
        fVar197 = fStack_1ad0 * auVar178._8_4_ +
                  fStack_1b00 * auVar186._8_4_ + fStack_1af0 * auVar79._8_4_;
        fVar201 = fStack_1acc * auVar178._12_4_ +
                  fStack_1afc * auVar186._12_4_ + fVar150 * auVar79._12_4_;
        auVar119._0_4_ = fVar190 + fVar190;
        auVar119._4_4_ = fVar193 + fVar193;
        auVar119._8_4_ = fVar197 + fVar197;
        auVar119._12_4_ = fVar201 + fVar201;
        auVar88._0_4_ = fVar132 * auVar79._0_4_;
        auVar88._4_4_ = fVar141 * auVar79._4_4_;
        auVar88._8_4_ = fVar146 * auVar79._8_4_;
        auVar88._12_4_ = fVar151 * auVar79._12_4_;
        fVar156 = fVar188 * auVar178._0_4_ + fVar149 * auVar186._0_4_ + auVar88._0_4_;
        fVar225 = fVar192 * auVar178._4_4_ + fVar163 * auVar186._4_4_ + auVar88._4_4_;
        fVar151 = fVar198 * auVar178._8_4_ + fVar170 * auVar186._8_4_ + auVar88._8_4_;
        fVar219 = fVar219 * auVar178._12_4_ + fVar171 * auVar186._12_4_ + auVar88._12_4_;
        auVar157 = rcpps(auVar88,auVar119);
        fVar190 = auVar157._0_4_;
        fVar193 = auVar157._4_4_;
        fVar197 = auVar157._8_4_;
        fVar201 = auVar157._12_4_;
        fVar190 = ((1.0 - auVar119._0_4_ * fVar190) * fVar190 + fVar190) * (fVar156 + fVar156);
        fVar193 = ((1.0 - auVar119._4_4_ * fVar193) * fVar193 + fVar193) * (fVar225 + fVar225);
        fVar197 = ((1.0 - auVar119._8_4_ * fVar197) * fVar197 + fVar197) * (fVar151 + fVar151);
        fVar201 = ((1.0 - auVar119._12_4_ * fVar201) * fVar201 + fVar201) * (fVar219 + fVar219);
        auVar120._0_4_ =
             (int)((uint)(auVar119._0_4_ != 0.0 &&
                         (fVar190 <= *(float *)&(This->intersector4_nofilter).name &&
                         *(float *)&(This->intersector1).pointQuery <= fVar190)) * -0x80000000) >>
             0x1f;
        auVar120._4_4_ =
             (int)((uint)(auVar119._4_4_ != 0.0 &&
                         (fVar193 <= *(float *)((long)&(This->intersector4_nofilter).name + 4) &&
                         *(float *)((long)&(This->intersector1).pointQuery + 4) <= fVar193)) *
                  -0x80000000) >> 0x1f;
        auVar120._8_4_ =
             (int)((uint)(auVar119._8_4_ != 0.0 &&
                         (fVar197 <= *(float *)&(This->intersector8).intersect &&
                         *(float *)&(This->intersector1).name <= fVar197)) * -0x80000000) >> 0x1f;
        auVar120._12_4_ =
             (int)((uint)(auVar119._12_4_ != 0.0 &&
                         (fVar201 <= *(float *)((long)&(This->intersector8).intersect + 4) &&
                         *(float *)((long)&(This->intersector1).name + 4) <= fVar201)) * -0x80000000
                  ) >> 0x1f;
        auVar121 = auVar120 & auVar136;
        iVar33 = movmskps(iVar33,auVar121);
        if (iVar33 != 0) {
          local_1788 = CONCAT44(fVar176,fVar172);
          uStack_1780 = CONCAT44(fVar182,fVar181);
          local_1798 = CONCAT44(fVar210,fVar207);
          uStack_1790 = CONCAT44(fVar216,fVar213);
          uStack_19f0 = auVar99._8_8_;
          uStack_17a0 = uStack_19f0;
          local_17e8 = auVar79;
          local_17d8 = auVar186;
          local_17c8 = auVar178;
          local_17b8 = fVar190;
          fStack_17b4 = fVar193;
          fStack_17b0 = fVar197;
          fStack_17ac = fVar201;
          local_17a8 = auVar99._0_8_;
        }
      }
      uVar30 = *(uint *)(pre.super_Precalculations.grid + 0x18);
      lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)uVar30 * 8);
      uVar6 = *(uint *)(lVar3 + 0x34);
      auVar89._0_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).occluded) == 0);
      auVar89._4_4_ = -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
      auVar89._8_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).name) == 0);
      auVar89._12_4_ = -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
      auVar90 = ~auVar89 & auVar121;
      iVar33 = movmskps((int)*(long *)(*(long *)ray + 0x1e8),auVar90);
      if (iVar33 != 0) {
        uVar34 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
        if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) || (*(long *)(lVar3 + 0x48) != 0)) {
          auVar22._8_8_ = uStack_17a0;
          auVar22._0_8_ = local_17a8;
          fVar156 = (float)((ulong)local_17a8 >> 0x20);
          fVar219 = (float)((ulong)uStack_17a0 >> 0x20);
          auVar157 = rcpps(ZEXT416(uVar6),auVar22);
          fVar190 = auVar157._0_4_;
          fVar193 = auVar157._4_4_;
          fVar197 = auVar157._8_4_;
          fVar201 = auVar157._12_4_;
          fVar190 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_17a8 & uVar29)) &
                           (uint)(((float)DAT_01feca10 - (float)local_17a8 * fVar190) * fVar190 +
                                 fVar190));
          fVar193 = (float)(-(uint)(1e-18 <= (float)((uint)fVar156 & uVar196)) &
                           (uint)((DAT_01feca10._4_4_ - fVar156 * fVar193) * fVar193 + fVar193));
          fVar197 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_17a0 & uVar200)) &
                           (uint)((DAT_01feca10._8_4_ - (float)uStack_17a0 * fVar197) * fVar197 +
                                 fVar197));
          fVar201 = (float)(-(uint)(1e-18 <= (float)((uint)fVar219 & uVar204)) &
                           (uint)((DAT_01feca10._12_4_ - fVar219 * fVar201) * fVar201 + fVar201));
          auVar73._0_4_ = (float)local_1788 * fVar190;
          auVar73._4_4_ = local_1788._4_4_ * fVar193;
          auVar73._8_4_ = (float)uStack_1780 * fVar197;
          auVar73._12_4_ = uStack_1780._4_4_ * fVar201;
          auVar157 = minps(auVar73,_DAT_01feca10);
          auVar103._0_4_ = fVar190 * (float)local_1798;
          auVar103._4_4_ = fVar193 * local_1798._4_4_;
          auVar103._8_4_ = fVar197 * (float)uStack_1790;
          auVar103._12_4_ = fVar201 * uStack_1790._4_4_;
          auVar79 = minps(auVar103,_DAT_01feca10);
          uVar29 = *(uint *)(pGVar48 + lVar41);
          uVar196 = *(uint *)(pGVar48 + lVar41 + 4);
          auVar138._4_4_ = uVar29;
          auVar138._0_4_ = uVar29;
          auVar138._8_4_ = uVar29;
          auVar138._12_4_ = uVar29;
          auVar123._4_4_ = uVar196;
          auVar123._0_4_ = uVar196;
          auVar123._8_4_ = uVar196;
          auVar123._12_4_ = uVar196;
          auVar178 = pblendw(auVar138,(undefined1  [16])0x0,0xaa);
          fVar51 = (float)DAT_0201c970;
          fVar75 = DAT_0201c970._4_4_;
          fVar76 = DAT_0201c970._8_4_;
          fVar77 = DAT_0201c970._12_4_;
          fVar190 = auVar157._0_4_;
          fVar193 = auVar157._4_4_;
          fVar197 = auVar157._8_4_;
          fVar201 = auVar157._12_4_;
          fVar156 = auVar79._0_4_;
          fVar131 = ((float)DAT_01feca10 - fVar190) - fVar156;
          fVar219 = auVar79._4_4_;
          fVar140 = (DAT_01feca10._4_4_ - fVar193) - fVar219;
          fVar225 = auVar79._8_4_;
          fVar145 = (DAT_01feca10._8_4_ - fVar197) - fVar225;
          fVar151 = auVar79._12_4_;
          fVar150 = (DAT_01feca10._12_4_ - fVar201) - fVar151;
          auVar79 = pblendw(auVar123,(undefined1  [16])0x0,0xaa);
          uVar200 = *(uint *)(local_1a98 + lVar41);
          auVar104._4_4_ = uVar200;
          auVar104._0_4_ = uVar200;
          auVar104._8_4_ = uVar200;
          auVar104._12_4_ = uVar200;
          auVar157 = pblendw(auVar104,(undefined1  [16])0x0,0xaa);
          local_1938 = (float)auVar157._0_4_ * fVar51 * fVar190 +
                       (float)auVar79._0_4_ * fVar51 * fVar156 +
                       (float)auVar178._0_4_ * fVar51 * fVar131;
          fStack_1934 = (float)auVar157._4_4_ * fVar75 * fVar193 +
                        (float)auVar79._4_4_ * fVar75 * fVar219 +
                        (float)auVar178._4_4_ * fVar75 * fVar140;
          fStack_1930 = (float)auVar157._8_4_ * fVar76 * fVar197 +
                        (float)auVar79._8_4_ * fVar76 * fVar225 +
                        (float)auVar178._8_4_ * fVar76 * fVar145;
          fStack_192c = (float)auVar157._12_4_ * fVar77 * fVar201 +
                        (float)auVar79._12_4_ * fVar77 * fVar151 +
                        (float)auVar178._12_4_ * fVar77 * fVar150;
          local_1928 = (float)(uVar200 >> 0x10) * fVar51 * fVar190 +
                       (float)(uVar196 >> 0x10) * fVar51 * fVar156 +
                       fVar131 * (float)(uVar29 >> 0x10) * fVar51;
          fStack_1924 = (float)(uVar200 >> 0x10) * fVar75 * fVar193 +
                        (float)(uVar196 >> 0x10) * fVar75 * fVar219 +
                        fVar140 * (float)(uVar29 >> 0x10) * fVar75;
          fStack_1920 = (float)(uVar200 >> 0x10) * fVar76 * fVar197 +
                        (float)(uVar196 >> 0x10) * fVar76 * fVar225 +
                        fVar145 * (float)(uVar29 >> 0x10) * fVar76;
          fStack_191c = (float)(uVar200 >> 0x10) * fVar77 * fVar201 +
                        (float)(uVar196 >> 0x10) * fVar77 * fVar151 +
                        fVar150 * (float)(uVar29 >> 0x10) * fVar77;
          local_1968 = local_17c8._0_8_;
          uStack_1960 = local_17c8._8_8_;
          local_1958 = local_17d8._0_8_;
          uStack_1950 = local_17d8._8_8_;
          local_1948 = local_17e8;
          local_18f8 = **(undefined4 **)(ray + 8);
          local_18e8 = (*(undefined4 **)(ray + 8))[1];
          auVar157 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
          auVar21._4_4_ = fStack_17b4;
          auVar21._0_4_ = local_17b8;
          auVar21._8_4_ = fStack_17b0;
          auVar21._12_4_ = fStack_17ac;
          auVar79 = blendvps(auVar157,auVar21,auVar90);
          *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar79;
          args.valid = (int *)local_1ab8;
          args.geometryUserPtr = *(void **)(lVar3 + 0x18);
          args.context = *(RTCRayQueryContext **)(ray + 8);
          args.hit = (RTCHitN *)&local_1968;
          args.N = 4;
          pRVar32 = *(RTCRayN **)(lVar3 + 0x48);
          local_1ab8 = auVar90;
          args.ray = (RTCRayN *)This;
          local_1918 = uVar34;
          uStack_1914 = uVar34;
          uStack_1910 = uVar34;
          uStack_190c = uVar34;
          local_1908 = uVar30;
          uStack_1904 = uVar30;
          uStack_1900 = uVar30;
          uStack_18fc = uVar30;
          uStack_18f4 = local_18f8;
          uStack_18f0 = local_18f8;
          uStack_18ec = local_18f8;
          uStack_18e4 = local_18e8;
          uStack_18e0 = local_18e8;
          uStack_18dc = local_18e8;
          if (pRVar32 != (RTCRayN *)0x0) {
            pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
          }
          if (local_1ab8 == (undefined1  [16])0x0) {
            auVar105._8_4_ = 0xffffffff;
            auVar105._0_8_ = 0xffffffffffffffff;
            auVar105._12_4_ = 0xffffffff;
            auVar105 = auVar105 ^ _DAT_01febe20;
          }
          else {
            pcVar7 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
            if ((pcVar7 != (code *)0x0) &&
               (((**(byte **)(ray + 0x10) & 2) != 0 || ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))) {
              (*pcVar7)(&args);
            }
            auVar74._0_4_ = -(uint)(local_1ab8._0_4_ == 0);
            auVar74._4_4_ = -(uint)(local_1ab8._4_4_ == 0);
            auVar74._8_4_ = -(uint)(local_1ab8._8_4_ == 0);
            auVar74._12_4_ = -(uint)(local_1ab8._12_4_ == 0);
            auVar105 = auVar74 ^ _DAT_01febe20;
            auVar79 = blendvps((undefined1  [16])_DAT_01feba00,
                               *(undefined1 (*) [16])(args.ray + 0x80),auVar74);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar79;
            pRVar32 = args.ray;
          }
          uVar30 = (uint)pRVar32;
          auVar107._0_4_ = auVar105._0_4_ << 0x1f;
          auVar107._4_4_ = auVar105._4_4_ << 0x1f;
          auVar107._8_4_ = auVar105._8_4_ << 0x1f;
          auVar107._12_4_ = auVar105._12_4_ << 0x1f;
          auVar90._0_4_ = auVar107._0_4_ >> 0x1f;
          auVar90._4_4_ = auVar107._4_4_ >> 0x1f;
          auVar90._8_4_ = auVar107._8_4_ >> 0x1f;
          auVar90._12_4_ = auVar107._12_4_ >> 0x1f;
          auVar157 = blendvps(auVar157,*(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                              auVar107);
          *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar157;
        }
        auVar86 = ~auVar90 & auVar86;
      }
      fVar201 = INFINITY;
      fVar197 = INFINITY;
      fVar193 = INFINITY;
      fVar190 = INFINITY;
      uVar29 = movmskps(uVar30,auVar86);
      pGVar31 = (GridSOA *)(ulong)uVar29;
      lVar41 = lVar41 + 4;
    } while (uVar29 != 0);
    if (uVar28 == 2) break;
  }
  uVar28 = (uint)pGVar31;
  auVar169._0_8_ = auVar86._0_8_ ^ 0xffffffffffffffff;
  auVar169._8_4_ = auVar86._8_4_ ^ 0xffffffff;
  auVar169._12_4_ = auVar86._12_4_ ^ 0xffffffff;
  sVar38 = 0;
LAB_0025426a:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       (auVar169 | (undefined1  [16])terminated.field_0);
  iVar33 = movmskps(uVar28,(undefined1  [16])terminated.field_0);
  if (iVar33 == 0xf) {
LAB_002542ce:
    iVar33 = 3;
  }
  else {
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         blendvps((undefined1  [16])tray.tfar.field_0,(undefined1  [16])_DAT_01feba00,
                  (undefined1  [16])terminated.field_0);
    iVar33 = 0;
    if (sVar38 != 0) {
      pNVar49->ptr = sVar38;
      pNVar49 = pNVar49 + 1;
      *paVar45 = _DAT_01feba00;
      paVar45 = paVar45 + 1;
    }
  }
LAB_002542d1:
  paVar44 = paVar45;
  if (iVar33 == 3) {
    auVar91._4_4_ = uVar208 & terminated.field_0.i[1];
    auVar91._0_4_ = uVar205 & terminated.field_0.i[0];
    auVar91._8_4_ = uVar211 & terminated.field_0.i[2];
    auVar91._12_4_ = uVar214 & terminated.field_0.i[3];
    auVar91 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                       (undefined1  [16])_DAT_01feba00,auVar91);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar91;
    return;
  }
  goto LAB_00252cf1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }